

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

int narrow_conv_backprop(NarrowConv *nc,IRRef ref,int depth)

{
  double dVar1;
  byte bVar2;
  ushort uVar3;
  jit_State *pjVar4;
  uint *puVar5;
  NarrowIns *pNVar6;
  NarrowIns NVar7;
  int iVar8;
  int iVar9;
  IRIns *pIVar10;
  IRIns *pIVar11;
  BPropEntry *pBVar12;
  double dVar13;
  int count;
  NarrowIns *savesp;
  BPropEntry *bp;
  IRRef mode;
  IRIns *cr;
  int32_t k;
  int64_t k64;
  lua_Number n;
  IRRef cref;
  IRIns *ir;
  jit_State *J;
  int depth_local;
  IRRef ref_local;
  NarrowConv *nc_local;
  
  pjVar4 = nc->J;
  pIVar10 = (pjVar4->cur).ir + ref;
  if (nc->sp < nc->maxsp) {
    if (((pIVar10->field_1).o == '[') && (((ulong)*pIVar10 & 0x1f0000) == 0x130000)) {
      if ((nc->mode & 0xf000) < 0x1001) {
        narrow_stripov_backprop(nc,(uint)(pIVar10->field_0).op1,depth + 1);
      }
      else {
        uVar3 = (pIVar10->field_0).op1;
        puVar5 = nc->sp;
        nc->sp = puVar5 + 1;
        *puVar5 = (uint)uVar3;
      }
      if (nc->t == IRT_I64) {
        pNVar6 = nc->sp;
        nc->sp = pNVar6 + 1;
        *pNVar6 = 0x20000;
      }
      nc_local._4_4_ = 0;
    }
    else if ((pIVar10->field_1).o == '\x1c') {
      dVar1 = *(double *)&pIVar10[1].i;
      if ((nc->mode & 0xf000) == 0) {
        dVar13 = (double)(long)dVar1;
        if ((dVar1 == dVar13) && (!NAN(dVar1) && !NAN(dVar13))) {
          pNVar6 = nc->sp;
          nc->sp = pNVar6 + 1;
          *pNVar6 = 0x30000;
          pNVar6 = nc->sp;
          nc->sp = pNVar6 + 1;
          *pNVar6 = (NarrowIns)(long)dVar1;
          return 0;
        }
      }
      else {
        NVar7 = (NarrowIns)dVar1;
        if (NVar7 == (int)(short)NVar7) {
          if ((dVar1 == (double)(int)NVar7) && (!NAN(dVar1) && !NAN((double)(int)NVar7))) {
            pNVar6 = nc->sp;
            nc->sp = pNVar6 + 1;
            *pNVar6 = 0x30000;
            pNVar6 = nc->sp;
            nc->sp = pNVar6 + 1;
            *pNVar6 = NVar7;
            return 0;
          }
        }
      }
      nc_local._4_4_ = 10;
    }
    else {
      uVar3 = pjVar4->chain[(pjVar4->fold).ins.field_1.o];
      while (n._4_4_ = (uint)uVar3, ref < n._4_4_) {
        pIVar11 = (pjVar4->cur).ir + n._4_4_;
        if (((pIVar11->field_0).op1 == ref) &&
           (((pjVar4->fold).ins.field_1.o == '\\' ||
            (((*(ushort *)((long)pIVar11 + 2) & 0xfff) == (nc->mode & 0xfff) &&
             (((pjVar4->fold).ins.field_1.t.irt & 0x80) <= (*(byte *)((long)pIVar11 + 4) & 0x80)))))
           )) {
          pNVar6 = nc->sp;
          nc->sp = pNVar6 + 1;
          *pNVar6 = n._4_4_;
          return 0;
        }
        uVar3 = *(ushort *)((long)pIVar11 + 6);
      }
      if (((pIVar10->field_1).o == ')') || ((pIVar10->field_1).o == '*')) {
        bp._4_4_ = nc->mode;
        if (((bp._4_4_ & 0xf000) == 0x2000) && (0 < depth)) {
          bp._4_4_ = bp._4_4_ + 0x1000;
        }
        pBVar12 = narrow_bpc_get(nc->J,(IRRef1)ref,bp._4_4_);
        if (pBVar12 != (BPropEntry *)0x0) {
          uVar3 = pBVar12->val;
          puVar5 = nc->sp;
          nc->sp = puVar5 + 1;
          *puVar5 = (uint)uVar3;
          return 0;
        }
        if ((nc->t == IRT_I64) &&
           (pBVar12 = narrow_bpc_get(nc->J,(IRRef1)ref,0x226e), pBVar12 != (BPropEntry *)0x0)) {
          uVar3 = pBVar12->val;
          puVar5 = nc->sp;
          nc->sp = puVar5 + 1;
          *puVar5 = (uint)uVar3;
          pNVar6 = nc->sp;
          nc->sp = pNVar6 + 1;
          *pNVar6 = 0x20000;
          return 0;
        }
        iVar8 = depth + 1;
        if ((iVar8 < 100) && (nc->sp < nc->maxsp)) {
          pNVar6 = nc->sp;
          iVar9 = narrow_conv_backprop(nc,(uint)(pIVar10->field_0).op1,iVar8);
          iVar8 = narrow_conv_backprop(nc,(uint)*(ushort *)((long)pIVar10 + 2),iVar8);
          if (iVar8 + iVar9 < 2) {
            bVar2 = (pIVar10->field_1).o;
            pNVar6 = nc->sp;
            nc->sp = pNVar6 + 1;
            *pNVar6 = ((uint)bVar2 << 8 | nc->t) * 0x10000 + ref;
            return iVar8 + iVar9;
          }
          nc->sp = pNVar6;
        }
      }
      pNVar6 = nc->sp;
      nc->sp = pNVar6 + 1;
      *pNVar6 = ref + 0x10000;
      nc_local._4_4_ = 1;
    }
  }
  else {
    nc_local._4_4_ = 10;
  }
  return nc_local._4_4_;
}

Assistant:

static int narrow_conv_backprop(NarrowConv *nc, IRRef ref, int depth)
{
  jit_State *J = nc->J;
  IRIns *ir = IR(ref);
  IRRef cref;

  if (nc->sp >= nc->maxsp) return 10;  /* Path too deep. */

  /* Check the easy cases first. */
  if (ir->o == IR_CONV && (ir->op2 & IRCONV_SRCMASK) == IRT_INT) {
    if ((nc->mode & IRCONV_CONVMASK) <= IRCONV_ANY)
      narrow_stripov_backprop(nc, ir->op1, depth+1);
    else
      *nc->sp++ = NARROWINS(NARROW_REF, ir->op1);  /* Undo conversion. */
    if (nc->t == IRT_I64)
      *nc->sp++ = NARROWINS(NARROW_SEXT, 0);  /* Sign-extend integer. */
    return 0;
  } else if (ir->o == IR_KNUM) {  /* Narrow FP constant. */
    lua_Number n = ir_knum(ir)->n;
    if ((nc->mode & IRCONV_CONVMASK) == IRCONV_TOBIT) {
      /* Allows a wider range of constants. */
      int64_t k64 = (int64_t)n;
      if (n == (lua_Number)k64) {  /* Only if const doesn't lose precision. */
	*nc->sp++ = NARROWINS(NARROW_INT, 0);
	*nc->sp++ = (NarrowIns)k64;  /* But always truncate to 32 bits. */
	return 0;
      }
    } else {
      int32_t k = lj_num2int(n);
      /* Only if constant is a small integer. */
      if (checki16(k) && n == (lua_Number)k) {
	*nc->sp++ = NARROWINS(NARROW_INT, 0);
	*nc->sp++ = (NarrowIns)k;
	return 0;
      }
    }
    return 10;  /* Never narrow other FP constants (this is rare). */
  }

  /* Try to CSE the conversion. Stronger checks are ok, too. */
  cref = J->chain[fins->o];
  while (cref > ref) {
    IRIns *cr = IR(cref);
    if (cr->op1 == ref &&
	(fins->o == IR_TOBIT ||
	 ((cr->op2 & IRCONV_MODEMASK) == (nc->mode & IRCONV_MODEMASK) &&
	  irt_isguard(cr->t) >= irt_isguard(fins->t)))) {
      *nc->sp++ = NARROWINS(NARROW_REF, cref);
      return 0;  /* Already there, no additional conversion needed. */
    }
    cref = cr->prev;
  }

  /* Backpropagate across ADD/SUB. */
  if (ir->o == IR_ADD || ir->o == IR_SUB) {
    /* Try cache lookup first. */
    IRRef mode = nc->mode;
    BPropEntry *bp;
    /* Inner conversions need a stronger check. */
    if ((mode & IRCONV_CONVMASK) == IRCONV_INDEX && depth > 0)
      mode += IRCONV_CHECK-IRCONV_INDEX;
    bp = narrow_bpc_get(nc->J, (IRRef1)ref, mode);
    if (bp) {
      *nc->sp++ = NARROWINS(NARROW_REF, bp->val);
      return 0;
    } else if (nc->t == IRT_I64) {
      /* Try sign-extending from an existing (checked) conversion to int. */
      mode = (IRT_INT<<5)|IRT_NUM|IRCONV_INDEX;
      bp = narrow_bpc_get(nc->J, (IRRef1)ref, mode);
      if (bp) {
	*nc->sp++ = NARROWINS(NARROW_REF, bp->val);
	*nc->sp++ = NARROWINS(NARROW_SEXT, 0);
	return 0;
      }
    }
    if (++depth < NARROW_MAX_BACKPROP && nc->sp < nc->maxsp) {
      NarrowIns *savesp = nc->sp;
      int count = narrow_conv_backprop(nc, ir->op1, depth);
      count += narrow_conv_backprop(nc, ir->op2, depth);
      if (count <= 1) {  /* Limit total number of conversions. */
	*nc->sp++ = NARROWINS(IRT(ir->o, nc->t), ref);
	return count;
      }
      nc->sp = savesp;  /* Too many conversions, need to backtrack. */
    }
  }

  /* Otherwise add a conversion. */
  *nc->sp++ = NARROWINS(NARROW_CONV, ref);
  return 1;
}